

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void rd_2dim_slice(char **content,size_t *line_no,int *array,int *dim,int *shift,int *post)

{
  int iVar1;
  
  iVar1 = *shift;
  if (post[1] + *post + shift[1] + iVar1 != 0) {
    if (iVar1 < *dim - *post) {
      do {
        rd_1dim_slice(content,line_no,array + dim[1] * iVar1,dim[1],shift[1],post[1]);
        iVar1 = iVar1 + 1;
      } while (iVar1 < *dim - *post);
    }
    return;
  }
  rd_1dim_slice(content,line_no,array,*dim * dim[1],0,0);
  return;
}

Assistant:

PRIVATE void
rd_2dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim[2],
              int     shift[2],
              int     post[2])
{
  int i;
  int delta_pre   = shift[0] + shift[1];
  int delta_post  = post[0] + post[1];

  if (delta_pre + delta_post == 0) {
    rd_1dim(content, line_no, array, dim[0] * dim[1], 0);
    return;
  }

  for (i = shift[0]; i < dim[0] - post[0]; i++)
    rd_1dim_slice(content, line_no, array + (i * dim[1]), dim[1], shift[1], post[1]);
  return;
}